

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter_avx2.c
# Opt level: O3

void av1_apply_temporal_filter_avx2
               (YV12_BUFFER_CONFIG *frame_to_filter,MACROBLOCKD *mbd,BLOCK_SIZE block_size,
               int mb_row,int mb_col,int num_planes,double *noise_levels,MV *subblock_mvs,
               int *subblock_mses,int q_factor,int filter_strength,int tf_wgt_calc_lvl,uint8_t *pred
               ,uint32_t *accum,uint16_t *count)

{
  undefined1 auVar1 [16];
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  byte bVar6;
  double dVar7;
  double dVar8;
  byte bVar9;
  byte bVar10;
  bool bVar11;
  uint uVar12;
  undefined1 (*pauVar13) [32];
  long lVar14;
  uint16_t *puVar15;
  ulong uVar16;
  ulong uVar17;
  uint32_t *puVar18;
  int iVar19;
  uint uVar20;
  undefined7 in_register_00000011;
  long lVar21;
  int iVar22;
  int iVar23;
  undefined1 (*pauVar24) [32];
  undefined4 *puVar25;
  uint uVar26;
  uint uVar28;
  undefined1 (*pauVar30) [16];
  ulong uVar31;
  undefined4 *puVar32;
  int *piVar33;
  int iVar34;
  uint uVar35;
  undefined4 *puVar36;
  ulong uVar37;
  undefined1 (*pauVar38) [32];
  int iVar39;
  undefined1 (*pauVar40) [32];
  undefined1 (*pauVar41) [32];
  double dVar42;
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar48 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [28];
  undefined1 auVar65 [32];
  double d_factor_decayed [4];
  double subblock_mses_scaled [4];
  __m256d subblock_mses_reg [4];
  uint16_t frame_sse [1088];
  uint32_t luma_sse_sum [1024];
  uint32_t acc_5x5_sse [32] [32];
  ulong local_2bd0;
  int local_2bac;
  double local_2b20;
  double local_2af0 [4];
  double local_2ad0 [4];
  undefined1 local_2ab0 [16];
  undefined8 local_2aa0;
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined1 local_2a60 [32];
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [16];
  double dStack_29f0;
  double dStack_29e8;
  double local_29e0;
  double dStack_29d8;
  double dStack_29d0;
  double dStack_29c8;
  double local_29c0;
  double dStack_29b8;
  double dStack_29b0;
  double dStack_29a8;
  double local_29a0;
  double dStack_2998;
  double dStack_2990;
  double dStack_2988;
  double local_2980;
  double dStack_2978;
  double dStack_2970;
  double dStack_2968;
  double local_2960 [7];
  double dStack_2928;
  double local_2920;
  double dStack_2918;
  double dStack_2910;
  double dStack_2908;
  double local_2900;
  double dStack_28f8;
  double dStack_28f0;
  double dStack_28e8;
  ushort local_28e0 [16];
  undefined4 auStack_28c0 [8];
  undefined4 auStack_28a0 [528];
  int local_2060 [1024];
  undefined4 local_1060 [1036];
  ulong uVar27;
  ulong uVar29;
  undefined1 auVar53 [32];
  
  uVar17 = CONCAT71(in_register_00000011,block_size) & 0xffffffff;
  bVar2 = block_size_high[uVar17];
  bVar3 = block_size_wide[uVar17];
  iVar22 = (frame_to_filter->field_2).field_0.y_crop_width;
  iVar19 = (frame_to_filter->field_3).field_0.y_crop_height;
  memset(local_28e0,0,0x880);
  memset(local_2060,0,0x1000);
  if (iVar19 < iVar22) {
    iVar22 = iVar19;
  }
  if (q_factor < 0x80) {
    dVar42 = (double)q_factor / 20.0;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = dVar42 * dVar42;
    auVar55 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar44);
    auVar44 = vcmpsd_avx(auVar44,ZEXT816(0x3ee4f8b588e368f1),1);
    auVar44 = vblendvpd_avx(auVar55,ZEXT816(0x3ee4f8b588e368f1),auVar44);
    local_2b20 = auVar44._0_8_;
  }
  else {
    dVar42 = (double)q_factor * 0.015625;
    local_2b20 = dVar42 * dVar42 * 0.5;
  }
  auVar44 = ZEXT816(0x3ff0000000000000);
  auVar61 = ZEXT1664(auVar44);
  if (0 < num_planes) {
    auVar55 = vpshufb_avx(*(undefined1 (*) [16])subblock_mvs,_DAT_0056b1b0);
    auVar47 = vpshufb_avx(*(undefined1 (*) [16])subblock_mvs,_DAT_0056b1c0);
    auVar55 = vpmovsxwd_avx(auVar55);
    auVar47 = vpmovsxwd_avx(auVar47);
    auVar65 = vcvtdq2pd_avx(auVar55);
    auVar56 = vcvtdq2pd_avx(auVar47);
    auVar46._0_8_ = auVar65._0_8_ * auVar65._0_8_ + auVar56._0_8_ * auVar56._0_8_;
    auVar46._8_8_ = auVar65._8_8_ * auVar65._8_8_ + auVar56._8_8_ * auVar56._8_8_;
    auVar46._16_8_ = auVar65._16_8_ * auVar65._16_8_ + auVar56._16_8_ * auVar56._16_8_;
    auVar46._24_8_ = auVar65._24_8_ * auVar65._24_8_ + auVar56._24_8_ * auVar56._24_8_;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = (double)iVar22 * 0.1;
    auVar55 = vmaxsd_avx(auVar55,auVar44);
    auVar56._0_8_ = auVar55._0_8_;
    auVar56._8_8_ = auVar56._0_8_;
    auVar56._16_8_ = auVar56._0_8_;
    auVar56._24_8_ = auVar56._0_8_;
    auVar65 = vsqrtpd_avx(auVar46);
    auVar65 = vdivpd_avx(auVar65,auVar56);
    auVar47._8_8_ = 0;
    auVar47._0_8_ = (double)filter_strength * 0.25 * (double)filter_strength * 0.25;
    auVar55 = vminsd_avx(auVar44,auVar47);
    auVar59._8_8_ = 0x3ff0000000000000;
    auVar59._0_8_ = 0x3ff0000000000000;
    auVar59._16_8_ = 0x3ff0000000000000;
    auVar59._24_8_ = 0x3ff0000000000000;
    _local_2a00 = vmaxpd_avx(auVar65,auVar59);
    auVar44 = vcmpsd_avx(auVar47,ZEXT816(0x3ee4f8b588e368f1),1);
    local_2ab0 = vblendvpd_avx(auVar55,ZEXT816(0x3ee4f8b588e368f1),auVar44);
    uVar17 = 0;
    local_2bac = 0;
    do {
      iVar22 = mbd->plane[uVar17].subsampling_x;
      iVar19 = mbd->plane[uVar17].subsampling_y;
      bVar9 = bVar2 >> ((byte)iVar19 & 0x1f);
      uVar26 = (uint)bVar9;
      uVar27 = (ulong)uVar26;
      bVar10 = bVar3 >> ((byte)iVar22 & 0x1f);
      uVar28 = (uint)bVar10;
      uVar29 = (ulong)uVar28;
      iVar22 = iVar22 - mbd->plane[0].subsampling_x;
      iVar19 = iVar19 - mbd->plane[0].subsampling_y;
      bVar4 = (byte)iVar19;
      bVar6 = (byte)iVar22;
      dVar42 = 0.04;
      if (uVar17 != 0) {
        dVar42 = auVar61._0_8_ / (double)((1 << (bVar4 + bVar6 & 0x1f)) + 0x19);
      }
      uVar5 = *(uint *)((long)frame_to_filter->store_buf_adr + (ulong)(uVar17 != 0) * 4 + -0x28);
      pauVar13 = (undefined1 (*) [32])
                 (frame_to_filter->store_buf_adr[uVar17 - 4] +
                 (int)(uVar28 * mb_col + uVar5 * uVar26 * mb_row));
      dVar43 = log(noise_levels[uVar17] + noise_levels[uVar17] + 5.0);
      if ((uVar17 == 1) && (uVar26 != 0)) {
        uVar12 = 1 << (bVar4 & 0x1f);
        uVar20 = 1 << (bVar6 & 0x1f);
        if ((int)uVar20 < 2) {
          uVar20 = 1;
        }
        if ((int)uVar12 < 2) {
          uVar12 = 1;
        }
        local_2bd0 = 0;
        do {
          if (uVar28 != 0) {
            uVar31 = 0;
            do {
              if (iVar19 != 0x1f) {
                iVar34 = ((int)uVar31 << (bVar6 & 0x1f)) +
                         ((int)local_2bd0 << (bVar4 & 0x1f)) * 0x22;
                lVar14 = uVar31 + local_2bd0 * 0x20;
                uVar35 = 0;
                do {
                  if (iVar22 != 0x1f) {
                    iVar39 = local_2060[lVar14];
                    uVar37 = (ulong)uVar20;
                    iVar23 = iVar34;
                    do {
                      iVar39 = iVar39 + (uint)local_28e0[iVar23];
                      iVar23 = iVar23 + 1;
                      uVar37 = uVar37 - 1;
                    } while (uVar37 != 0);
                    local_2060[lVar14] = iVar39;
                  }
                  uVar35 = uVar35 + 1;
                  iVar34 = iVar34 + 0x22;
                } while (uVar35 != uVar12);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != uVar29);
          }
          local_2bd0 = local_2bd0 + 1;
        } while (local_2bd0 != uVar27);
      }
      lVar14 = (long)local_2bac;
      pauVar40 = (undefined1 (*) [32])(pred + lVar14);
      if (uVar28 == 0x20) {
        auVar61 = ZEXT1664(ZEXT816(0x3ff0000000000000));
        auVar62 = ZEXT1664(ZEXT816(0x401c000000000000));
        auVar63 = ZEXT1664(CONCAT88(0xc01c000000000000,0xc01c000000000000));
        auVar64._8_4_ = 0x447a0000;
        auVar64._0_8_ = 0x447a0000447a0000;
        auVar64._12_4_ = 0x447a0000;
        auVar64._16_4_ = 0x447a0000;
        auVar64._20_4_ = 0x447a0000;
        auVar64._24_4_ = 0x447a0000;
        auVar65._8_4_ = 0x3f000000;
        auVar65._0_8_ = 0x3f0000003f000000;
        auVar65._12_4_ = 0x3f000000;
        auVar65._16_4_ = 0x3f000000;
        auVar65._20_4_ = 0x3f000000;
        auVar65._24_4_ = 0x3f000000;
        auVar65._28_4_ = 0x3f000000;
        if (uVar26 != 0) {
          lVar21 = 0;
          pauVar24 = pauVar40;
          do {
            auVar56 = vpmaxub_avx2(*pauVar13,*pauVar24);
            auVar46 = vpminub_avx2(*pauVar13,*pauVar24);
            auVar46 = vpsubusb_avx2(auVar56,auVar46);
            auVar56 = vpmovzxbw_avx2(auVar46._0_16_);
            auVar46 = vpmovzxbw_avx2(auVar46._16_16_);
            auVar56 = vpmullw_avx2(auVar56,auVar56);
            auVar46 = vpmullw_avx2(auVar46,auVar46);
            *(undefined1 (*) [32])((long)local_28e0 + lVar21) = auVar56;
            *(undefined1 (*) [32])((long)auStack_28c0 + lVar21) = auVar46;
            *(undefined4 *)((long)auStack_28a0 + lVar21) = 0;
            pauVar13 = (undefined1 (*) [32])(*pauVar13 + uVar5);
            pauVar24 = pauVar24 + 1;
            lVar21 = lVar21 + 0x44;
          } while (uVar26 * 0x44 != (int)lVar21);
          goto LAB_0048b631;
        }
LAB_0048b64c:
        puVar25 = local_1060;
        uVar31 = 0;
        do {
          pauVar30 = (undefined1 (*) [16])(local_28e0 + (uVar31 - 2));
          if (uVar31 == 0) {
            pauVar30 = (undefined1 (*) [16])local_28e0;
          }
          lVar21 = 0x40;
          do {
            auVar44 = *pauVar30;
            if (uVar31 == 0) {
              auVar44 = vpshufd_avx(auVar44,0x94);
              auVar44 = vpshuflw_avx(auVar44,0x40);
            }
            if (uVar31 == uVar28 - 4) {
              auVar44 = vpshufhw_avx(auVar44,0x54);
            }
            auVar56 = vpmovzxwd_avx2(auVar44);
            *(undefined1 (*) [32])((long)&local_2aa0 + lVar21) = auVar56;
            pauVar30 = (undefined1 (*) [16])(pauVar30[4] + 4);
            lVar21 = lVar21 + 0x20;
          } while (lVar21 != 0xa0);
          local_2aa0 = local_2a60._0_8_;
          uStack_2a98 = local_2a60._8_8_;
          uStack_2a90 = local_2a60._16_8_;
          uStack_2a88 = local_2a60._24_8_;
          local_2a80 = local_2a60._0_8_;
          uStack_2a78 = local_2a60._8_8_;
          uStack_2a70 = local_2a60._16_8_;
          uStack_2a68 = local_2a60._24_8_;
          if (uVar26 != 0) {
            uVar37 = 0;
            puVar32 = puVar25;
            do {
              auVar56 = local_2a40;
              uStack_2a88 = uStack_2a68;
              uStack_2a90 = uStack_2a70;
              uStack_2a98 = uStack_2a78;
              local_2aa0 = local_2a80;
              auVar54 = ZEXT1664((undefined1  [16])0x0);
              lVar21 = 0;
              do {
                auVar46 = vpaddd_avx2(auVar54._0_32_,
                                      *(undefined1 (*) [32])((long)&local_2aa0 + lVar21));
                auVar54 = ZEXT3264(auVar46);
                lVar21 = lVar21 + 0x20;
              } while (lVar21 != 0xa0);
              local_2a80 = local_2a60._0_8_;
              uStack_2a78 = local_2a60._8_8_;
              uStack_2a70 = local_2a60._16_8_;
              uStack_2a68 = local_2a60._24_8_;
              local_2a40 = local_2a20;
              local_2a60 = auVar56;
              if ((long)uVar37 <= (long)(int)(uVar26 - 4)) {
                auVar44 = *pauVar30;
                if (uVar31 == 0) {
                  auVar44 = vpshufd_avx(auVar44,0x94);
                  auVar44 = vpshuflw_avx(auVar44,0x40);
                }
                if (uVar31 == uVar28 - 4) {
                  auVar44 = vpshufhw_avx(auVar44,0x54);
                }
                local_2a20 = vpmovzxwd_avx2(auVar44);
                pauVar30 = (undefined1 (*) [16])(pauVar30[4] + 4);
              }
              lVar21 = 0;
              puVar36 = puVar32;
              do {
                auVar56 = vpand_avx2(auVar46,*(undefined1 (*) [32])((long)sse_bytemask[0] + lVar21))
                ;
                auVar44 = vphaddd_avx(auVar56._16_16_,auVar56._0_16_);
                auVar44 = vphaddd_avx(auVar44,auVar44);
                auVar44 = vphaddd_avx(auVar44,auVar44);
                *puVar36 = auVar44._0_4_;
                lVar21 = lVar21 + 0x20;
                puVar36 = puVar36 + 1;
              } while (lVar21 != 0x80);
              uVar37 = uVar37 + 1;
              puVar32 = puVar32 + 0x20;
            } while (uVar37 != uVar27);
          }
          uVar31 = uVar31 + 4;
          puVar25 = puVar25 + 4;
        } while (uVar31 < uVar29);
        bVar11 = true;
      }
      else {
        auVar61 = ZEXT1664(ZEXT816(0x3ff0000000000000));
        auVar62 = ZEXT1664(ZEXT816(0x401c000000000000));
        auVar63 = ZEXT1664(CONCAT88(0xc01c000000000000,0xc01c000000000000));
        auVar64._8_4_ = 0x447a0000;
        auVar64._0_8_ = 0x447a0000447a0000;
        auVar64._12_4_ = 0x447a0000;
        auVar64._16_4_ = 0x447a0000;
        auVar64._20_4_ = 0x447a0000;
        auVar64._24_4_ = 0x447a0000;
        auVar65._8_4_ = 0x3f000000;
        auVar65._0_8_ = 0x3f0000003f000000;
        auVar65._12_4_ = 0x3f000000;
        auVar65._16_4_ = 0x3f000000;
        auVar65._20_4_ = 0x3f000000;
        auVar65._24_4_ = 0x3f000000;
        auVar65._28_4_ = 0x3f000000;
        if (uVar26 != 0) {
          lVar21 = 0;
          pauVar24 = pauVar40;
          do {
            auVar56 = vpmovzxbw_avx2(*(undefined1 (*) [16])*pauVar13);
            auVar46 = vpmovzxbw_avx2(*(undefined1 (*) [16])*pauVar24);
            auVar56 = vpsubw_avx2(auVar56,auVar46);
            auVar56 = vpmullw_avx2(auVar56,auVar56);
            *(undefined1 (*) [32])((long)local_28e0 + lVar21) = auVar56;
            *(undefined4 *)((long)auStack_28c0 + lVar21) = 0;
            pauVar13 = (undefined1 (*) [32])(*pauVar13 + uVar5);
            pauVar24 = (undefined1 (*) [32])(*pauVar24 + uVar29);
            lVar21 = lVar21 + 0x44;
          } while (uVar26 * 0x44 != (int)lVar21);
        }
LAB_0048b631:
        if (uVar28 != 0) goto LAB_0048b64c;
        bVar11 = false;
      }
      local_2af0[3] = auVar61._0_8_ / ((dVar43 + 0.5) * local_2b20 * (double)local_2ab0._0_8_);
      local_2af0[0] = local_2af0[3] * (double)local_2a00._0_8_;
      local_2af0[1] = local_2af0[3] * (double)local_2a00._8_8_;
      local_2af0[2] = local_2af0[3] * dStack_29f0;
      local_2af0[3] = local_2af0[3] * dStack_29e8;
      auVar56 = vcvtdq2pd_avx(*(undefined1 (*) [16])subblock_mses);
      local_2ad0[0] = auVar56._0_8_ * 0.008333333333333333;
      local_2ad0[1] = auVar56._8_8_ * 0.008333333333333333;
      local_2ad0[2] = auVar56._16_8_ * 0.008333333333333333;
      local_2ad0[3] = auVar56._24_8_ * 0.008333333333333333;
      if (tf_wgt_calc_lvl == 0) {
        if (uVar26 != 0) {
          lVar21 = 0;
          puVar25 = local_1060;
          piVar33 = local_2060;
          uVar31 = 0;
          iVar22 = 0;
          do {
            if (bVar11) {
              uVar37 = 0;
              do {
                bVar4 = (*pauVar40)[(uint)((int)lVar21 + (int)uVar37)];
                uVar16 = (ulong)(((uint)(bVar10 >> 1 <= uVar37) | (uint)(bVar9 >> 1 <= uVar31) * 2)
                                << 3);
                dVar43 = ((double)(uint)(piVar33[uVar37] + puVar25[uVar37]) * dVar42 *
                          0.041666666666666664 + *(double *)((long)local_2ad0 + uVar16)) *
                         *(double *)((long)local_2af0 + uVar16);
                auVar49._0_8_ = -dVar43;
                auVar49._8_8_ = 0x8000000000000000;
                auVar45._8_8_ = 0;
                auVar45._0_8_ = dVar43;
                auVar44 = vcmpsd_avx(auVar45,auVar62._0_16_,1);
                auVar44 = vblendvpd_avx(auVar63._0_16_,auVar49,auVar44);
                dVar43 = exp(auVar44._0_8_);
                auVar63 = ZEXT1664(CONCAT88(0xc01c000000000000,0xc01c000000000000));
                auVar62 = ZEXT1664(ZEXT816(0x401c000000000000));
                count[lVar14 + (long)iVar22 + uVar37] =
                     count[lVar14 + (long)iVar22 + uVar37] + (short)(int)(dVar43 * 1000.0);
                accum[lVar14 + (long)iVar22 + uVar37] =
                     accum[lVar14 + (long)iVar22 + uVar37] + (uint)bVar4 * (int)(dVar43 * 1000.0);
                uVar37 = uVar37 + 1;
              } while (uVar29 != uVar37);
              iVar22 = iVar22 + (int)uVar37;
              auVar61 = ZEXT1664(ZEXT816(0x3ff0000000000000));
            }
            uVar31 = uVar31 + 1;
            piVar33 = piVar33 + 0x20;
            puVar25 = puVar25 + 0x20;
            lVar21 = lVar21 + uVar29;
          } while (uVar31 != uVar27);
        }
      }
      else {
        local_2960[0] = local_2ad0[0];
        local_2960[1] = local_2ad0[0];
        local_2960[2] = local_2ad0[0];
        local_2960[3] = local_2ad0[0];
        local_2960[4] = local_2ad0[1];
        local_2960[5] = local_2ad0[1];
        local_2960[6] = local_2ad0[1];
        dStack_2928 = local_2ad0[1];
        local_2920 = local_2ad0[2];
        dStack_2918 = local_2ad0[2];
        dStack_2910 = local_2ad0[2];
        dStack_2908 = local_2ad0[2];
        local_2900 = local_2ad0[3];
        dStack_28f8 = local_2ad0[3];
        dStack_28f0 = local_2ad0[3];
        dStack_28e8 = local_2ad0[3];
        local_29e0 = local_2af0[0];
        dStack_29d8 = local_2af0[0];
        dStack_29d0 = local_2af0[0];
        dStack_29c8 = local_2af0[0];
        local_29c0 = local_2af0[1];
        dStack_29b8 = local_2af0[1];
        dStack_29b0 = local_2af0[1];
        dStack_29a8 = local_2af0[1];
        local_29a0 = local_2af0[2];
        dStack_2998 = local_2af0[2];
        dStack_2990 = local_2af0[2];
        dStack_2988 = local_2af0[2];
        local_2980 = local_2af0[3];
        dStack_2978 = local_2af0[3];
        dStack_2970 = local_2af0[3];
        dStack_2968 = local_2af0[3];
        auVar60._8_4_ = 0x40e00000;
        auVar60._0_8_ = 0x40e0000040e00000;
        auVar60._12_4_ = 0x40e00000;
        auVar60._16_4_ = 0x40e00000;
        auVar60._20_4_ = 0x40e00000;
        auVar60._24_4_ = 0x40e00000;
        auVar60._28_4_ = 0x40e00000;
        if (uVar26 != 0) {
          puVar18 = accum + lVar14;
          puVar15 = count + lVar14;
          pauVar13 = (undefined1 (*) [32])local_1060;
          pauVar24 = (undefined1 (*) [32])local_2060;
          uVar31 = 0;
          do {
            if (bVar11) {
              uVar37 = 0;
              pauVar38 = pauVar13;
              pauVar41 = pauVar24;
              do {
                auVar56 = vlddqu_avx(*pauVar38);
                auVar46 = vlddqu_avx(*pauVar41);
                auVar56 = vpaddd_avx2(auVar46,auVar56);
                auVar46 = vcvtdq2pd_avx(auVar56._0_16_);
                auVar59 = vcvtdq2pd_avx(auVar56._16_16_);
                uVar16 = (ulong)(((uint)(bVar10 >> 1 <= uVar37) | (uint)(bVar9 >> 1 <= uVar31) * 2)
                                << 5);
                dVar43 = *(double *)((long)local_2960 + uVar16 + 8);
                dVar7 = *(double *)((long)local_2960 + uVar16 + 0x10);
                dVar8 = *(double *)((long)local_2960 + uVar16 + 0x18);
                auVar56 = *(undefined1 (*) [32])((long)&local_29e0 + uVar16);
                auVar57._0_8_ =
                     auVar56._0_8_ *
                     (*(double *)((long)local_2960 + uVar16) +
                     dVar42 * auVar46._0_8_ * 0.041666666666666664);
                auVar57._8_8_ =
                     auVar56._8_8_ * (dVar43 + dVar42 * auVar46._8_8_ * 0.041666666666666664);
                auVar57._16_8_ =
                     auVar56._16_8_ * (dVar7 + dVar42 * auVar46._16_8_ * 0.041666666666666664);
                auVar57._24_8_ =
                     auVar56._24_8_ * (dVar8 + dVar42 * auVar46._24_8_ * 0.041666666666666664);
                auVar50._0_8_ =
                     auVar56._0_8_ *
                     (*(double *)((long)local_2960 + uVar16) +
                     dVar42 * auVar59._0_8_ * 0.041666666666666664);
                auVar50._8_8_ =
                     auVar56._8_8_ * (dVar43 + dVar42 * auVar59._8_8_ * 0.041666666666666664);
                auVar50._16_8_ =
                     auVar56._16_8_ * (dVar7 + dVar42 * auVar59._16_8_ * 0.041666666666666664);
                auVar50._24_8_ =
                     auVar56._24_8_ * (dVar8 + dVar42 * auVar59._24_8_ * 0.041666666666666664);
                auVar44 = vcvtpd2ps_avx(auVar57);
                auVar55 = vcvtpd2ps_avx(auVar50);
                auVar51._16_16_ = auVar55;
                auVar51._0_16_ = auVar44;
                auVar56 = vminps_avx(auVar51,auVar60);
                auVar56 = vsubps_avx(SUB6432(ZEXT864(0),0),auVar56);
                auVar52._0_4_ = (int)(auVar56._0_4_ * 12102203.0);
                auVar52._4_4_ = (int)(auVar56._4_4_ * 12102203.0);
                auVar52._8_4_ = (int)(auVar56._8_4_ * 12102203.0);
                auVar52._12_4_ = (int)(auVar56._12_4_ * 12102203.0);
                auVar52._16_4_ = (int)(auVar56._16_4_ * 12102203.0);
                auVar52._20_4_ = (int)(auVar56._20_4_ * 12102203.0);
                auVar52._24_4_ = (int)(auVar56._24_4_ * 12102203.0);
                auVar52._28_4_ = (int)auVar56._28_4_;
                auVar58._8_4_ = 0x3f7f127f;
                auVar58._0_8_ = 0x3f7f127f3f7f127f;
                auVar58._12_4_ = 0x3f7f127f;
                auVar58._16_4_ = 0x3f7f127f;
                auVar58._20_4_ = 0x3f7f127f;
                auVar58._24_4_ = 0x3f7f127f;
                auVar58._28_4_ = 0x3f7f127f;
                auVar56 = vpaddd_avx2(auVar52,auVar58);
                auVar48._0_4_ = (int)(auVar65._0_4_ + auVar64._0_4_ * auVar56._0_4_);
                auVar48._4_4_ = (int)(auVar65._4_4_ + auVar64._4_4_ * auVar56._4_4_);
                auVar48._8_4_ = (int)(auVar65._8_4_ + auVar64._8_4_ * auVar56._8_4_);
                auVar48._12_4_ = (int)(auVar65._12_4_ + auVar64._12_4_ * auVar56._12_4_);
                auVar53._16_4_ = (int)(auVar65._16_4_ + auVar64._16_4_ * auVar56._16_4_);
                auVar53._0_16_ = auVar48;
                auVar53._20_4_ = (int)(auVar65._20_4_ + auVar64._20_4_ * auVar56._20_4_);
                auVar53._24_4_ = (int)(auVar65._24_4_ + auVar64._24_4_ * auVar56._24_4_);
                auVar53._28_4_ = (int)(auVar65._28_4_ + auVar56._28_4_);
                auVar44 = vpackusdw_avx(auVar48,auVar53._16_16_);
                auVar44 = vpaddw_avx(auVar44,*(undefined1 (*) [16])(puVar15 + uVar37));
                *(undefined1 (*) [16])(puVar15 + uVar37) = auVar44;
                auVar1._8_8_ = 0;
                auVar1._0_8_ = *(ulong *)(*pauVar40 + uVar37);
                auVar56 = vpmovzxbd_avx2(auVar1);
                auVar56 = vpmulld_avx2(auVar53,auVar56);
                auVar56 = vpaddd_avx2(auVar56,*(undefined1 (*) [32])(puVar18 + uVar37));
                *(undefined1 (*) [32])(puVar18 + uVar37) = auVar56;
                uVar37 = uVar37 + 8;
                pauVar41 = pauVar41 + 1;
                pauVar38 = pauVar38 + 1;
              } while (uVar37 < uVar29);
            }
            uVar31 = uVar31 + 1;
            pauVar40 = (undefined1 (*) [32])(*pauVar40 + uVar29);
            puVar18 = (uint32_t *)((long)puVar18 + (ulong)(uVar28 * 4));
            puVar15 = (uint16_t *)((long)puVar15 + (ulong)(uVar28 * 2));
            pauVar24 = pauVar24 + 4;
            pauVar13 = pauVar13 + 4;
          } while (uVar31 != uVar27);
        }
      }
      local_2bac = local_2bac + uVar28 * uVar26;
      uVar17 = uVar17 + 1;
    } while (uVar17 != (uint)num_planes);
  }
  return;
}

Assistant:

void av1_apply_temporal_filter_avx2(
    const YV12_BUFFER_CONFIG *frame_to_filter, const MACROBLOCKD *mbd,
    const BLOCK_SIZE block_size, const int mb_row, const int mb_col,
    const int num_planes, const double *noise_levels, const MV *subblock_mvs,
    const int *subblock_mses, const int q_factor, const int filter_strength,
    int tf_wgt_calc_lvl, const uint8_t *pred, uint32_t *accum,
    uint16_t *count) {
  const int is_high_bitdepth = frame_to_filter->flags & YV12_FLAG_HIGHBITDEPTH;
  assert(block_size == BLOCK_32X32 && "Only support 32x32 block with avx2!");
  assert(TF_WINDOW_LENGTH == 5 && "Only support window length 5 with avx2!");
  assert(!is_high_bitdepth && "Only support low bit-depth with avx2!");
  assert(num_planes >= 1 && num_planes <= MAX_MB_PLANE);
  (void)is_high_bitdepth;

  const int mb_height = block_size_high[block_size];
  const int mb_width = block_size_wide[block_size];
  const int frame_height = frame_to_filter->y_crop_height;
  const int frame_width = frame_to_filter->y_crop_width;
  const int min_frame_size = AOMMIN(frame_height, frame_width);
  // Variables to simplify combined error calculation.
  const double inv_factor = 1.0 / ((TF_WINDOW_BLOCK_BALANCE_WEIGHT + 1) *
                                   TF_SEARCH_ERROR_NORM_WEIGHT);
  const double weight_factor =
      (double)TF_WINDOW_BLOCK_BALANCE_WEIGHT * inv_factor;
  // Adjust filtering based on q.
  // Larger q -> stronger filtering -> larger weight.
  // Smaller q -> weaker filtering -> smaller weight.
  double q_decay = pow((double)q_factor / TF_Q_DECAY_THRESHOLD, 2);
  q_decay = CLIP(q_decay, 1e-5, 1);
  if (q_factor >= TF_QINDEX_CUTOFF) {
    // Max q_factor is 255, therefore the upper bound of q_decay is 8.
    // We do not need a clip here.
    q_decay = 0.5 * pow((double)q_factor / 64, 2);
  }
  // Smaller strength -> smaller filtering weight.
  double s_decay = pow((double)filter_strength / TF_STRENGTH_THRESHOLD, 2);
  s_decay = CLIP(s_decay, 1e-5, 1);
  double d_factor[4] = { 0 };
  uint16_t frame_sse[SSE_STRIDE * BH] = { 0 };
  uint32_t luma_sse_sum[BW * BH] = { 0 };

  for (int subblock_idx = 0; subblock_idx < 4; subblock_idx++) {
    // Larger motion vector -> smaller filtering weight.
    const MV mv = subblock_mvs[subblock_idx];
    const double distance = sqrt(pow(mv.row, 2) + pow(mv.col, 2));
    double distance_threshold = min_frame_size * TF_SEARCH_DISTANCE_THRESHOLD;
    distance_threshold = AOMMAX(distance_threshold, 1);
    d_factor[subblock_idx] = distance / distance_threshold;
    d_factor[subblock_idx] = AOMMAX(d_factor[subblock_idx], 1);
  }

  // Handle planes in sequence.
  int plane_offset = 0;
  for (int plane = 0; plane < num_planes; ++plane) {
    const uint32_t plane_h = mb_height >> mbd->plane[plane].subsampling_y;
    const uint32_t plane_w = mb_width >> mbd->plane[plane].subsampling_x;
    const uint32_t frame_stride = frame_to_filter->strides[plane == 0 ? 0 : 1];
    const int frame_offset = mb_row * plane_h * frame_stride + mb_col * plane_w;

    const uint8_t *ref = frame_to_filter->buffers[plane] + frame_offset;
    const int ss_x_shift =
        mbd->plane[plane].subsampling_x - mbd->plane[AOM_PLANE_Y].subsampling_x;
    const int ss_y_shift =
        mbd->plane[plane].subsampling_y - mbd->plane[AOM_PLANE_Y].subsampling_y;
    const int num_ref_pixels = TF_WINDOW_LENGTH * TF_WINDOW_LENGTH +
                               ((plane) ? (1 << (ss_x_shift + ss_y_shift)) : 0);
    const double inv_num_ref_pixels = 1.0 / num_ref_pixels;
    // Larger noise -> larger filtering weight.
    const double n_decay = 0.5 + log(2 * noise_levels[plane] + 5.0);
    // Decay factors for non-local mean approach.
    const double decay_factor = 1 / (n_decay * q_decay * s_decay);

    // Filter U-plane and V-plane using Y-plane. This is because motion
    // search is only done on Y-plane, so the information from Y-plane
    // will be more accurate. The luma sse sum is reused in both chroma
    // planes.
    if (plane == AOM_PLANE_U) {
      for (unsigned int i = 0, k = 0; i < plane_h; i++) {
        for (unsigned int j = 0; j < plane_w; j++, k++) {
          for (int ii = 0; ii < (1 << ss_y_shift); ++ii) {
            for (int jj = 0; jj < (1 << ss_x_shift); ++jj) {
              const int yy = (i << ss_y_shift) + ii;  // Y-coord on Y-plane.
              const int xx = (j << ss_x_shift) + jj;  // X-coord on Y-plane.
              luma_sse_sum[i * BW + j] += frame_sse[yy * SSE_STRIDE + xx];
            }
          }
        }
      }
    }

    apply_temporal_filter(ref, frame_stride, pred + plane_offset, plane_w,
                          plane_w, plane_h, subblock_mses, accum + plane_offset,
                          count + plane_offset, frame_sse, luma_sse_sum,
                          inv_num_ref_pixels, decay_factor, inv_factor,
                          weight_factor, d_factor, tf_wgt_calc_lvl);
    plane_offset += plane_h * plane_w;
  }
}